

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Detonation_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::LE_Detonation_PDU::checkFlagsAndPDULength(LE_Detonation_PDU *this)

{
  KBOOL KVar1;
  KUINT8 KVar2;
  KUINT8 KVar3;
  LE_Detonation_PDU *this_local;
  
  KVar1 = GetMunitionEntityIDFlag(this);
  if (KVar1) {
    KVar2 = DATA_TYPE::LE_EntityIdentifier::GetSiteID(&(this->super_LE_Header).m_EntID);
    KVar3 = DATA_TYPE::LE_EntityIdentifier::GetSiteID(&this->m_MunitionID);
    if (KVar2 == KVar3) {
      KVar2 = DATA_TYPE::LE_EntityIdentifier::GetApplicationID(&(this->super_LE_Header).m_EntID);
      KVar3 = DATA_TYPE::LE_EntityIdentifier::GetApplicationID(&this->m_MunitionID);
      if (KVar2 == KVar3) {
        SetMunitionEntityIDSiteAppIncludedFlag(this,false);
        goto LAB_0017baff;
      }
    }
    SetMunitionEntityIDSiteAppIncludedFlag(this,true);
  }
  else {
    SetMunitionEntityIDSiteAppIncludedFlag(this,false);
  }
LAB_0017baff:
  KVar2 = DATA_TYPE::LE_EntityIdentifier::GetSiteID(&(this->super_LE_Header).m_EntID);
  KVar3 = DATA_TYPE::LE_EntityIdentifier::GetSiteID(&this->m_EventID);
  if (KVar2 == KVar3) {
    KVar2 = DATA_TYPE::LE_EntityIdentifier::GetApplicationID(&(this->super_LE_Header).m_EntID);
    KVar3 = DATA_TYPE::LE_EntityIdentifier::GetApplicationID(&this->m_EventID);
    if (KVar2 == KVar3) {
      SetEventIDSiteAppIncludedFlag(this,false);
      goto LAB_0017bb72;
    }
  }
  SetEventIDSiteAppIncludedFlag(this,true);
LAB_0017bb72:
  KVar1 = GetMunitionOrientationFlag(this);
  if ((KVar1) || (KVar1 = GetEventNumberIncludedFlag(this), KVar1)) {
    SetFlag2Flag(this,true);
  }
  else {
    SetFlag2Flag(this,false);
  }
  return;
}

Assistant:

void LE_Detonation_PDU::checkFlagsAndPDULength()
{
    // Check if the Munition ID field is included and set dependent
    // values accordingly.
    if( GetMunitionEntityIDFlag() )
    {
        // Check if the munition's's site and application values
        // are the same, if they are we don't include them.
        if( m_EntID.GetSiteID() == m_MunitionID.GetSiteID() &&
                m_EntID.GetApplicationID() == m_MunitionID.GetApplicationID() )
        {
            // They match so don't include the fields
            SetMunitionEntityIDSiteAppIncludedFlag( false );
        }
        else
        {
            // They don't match so we need to send these fields.
            SetMunitionEntityIDSiteAppIncludedFlag( true );
        }
    }
    else
    {
        SetMunitionEntityIDSiteAppIncludedFlag( false );
    }

    // Now check the event's site and application values
    if( m_EntID.GetSiteID() == m_EventID.GetSiteID() &&
            m_EntID.GetApplicationID() == m_EventID.GetApplicationID() )
    {
        SetEventIDSiteAppIncludedFlag( false );
    }
    else
    {
        SetEventIDSiteAppIncludedFlag( true );
    }

    // Check if the Event Number field or the Munition Orientation field
    // are set. Make sure that the Flag Octet 2 is set accordingly.
    if( GetMunitionOrientationFlag() || GetEventNumberIncludedFlag() )
    {
        SetFlag2Flag( true );
    }
    else
    {
        SetFlag2Flag( false );
    }

#ifdef _DEBUG
    {
        // Verify PDU length
        const KUINT16 ui16ExpectedPDULength = 32
            + 1*m_DetonationFlag1Union.m_ui8Flag2
            + 4*m_DetonationFlag1Union.m_ui8TargetId
            + (2*m_DetonationFlag1Union.m_ui8MunitionSiteApp + 2)*m_DetonationFlag1Union.m_ui8MunitionId
            + (2*m_DetonationFlag1Union.m_ui8EventSiteAppId + 2)*m_DetonationFlag2Union.m_ui8EventNum
            + 8*(1 - m_DetonationFlag1Union.m_ui8LocationTyp)
            + 6*m_DetonationFlag2Union.m_ui8MunitionOri
            + 4*m_DetonationFlag1Union.m_ui8WarheadFuse
            + 4*m_DetonationFlag1Union.m_ui8QuantRate
            + 6*m_DetonationFlag1Union.m_ui8LocationTyp;
        assert(ui16ExpectedPDULength == m_ui16PDULength);
    }
#endif
}